

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void * __thiscall
google::protobuf::FileDescriptorTables::FindParentForFieldsByMap
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  long lVar1;
  
  lVar1 = 0x20;
  if ((field->field_0x1 & 8) != 0) {
    if ((field->scope_).containing_oneof != (OneofDescriptor *)0x0) {
      return (field->scope_).containing_oneof;
    }
    lVar1 = 0x10;
  }
  return *(void **)(&field->super_SymbolBase + lVar1);
}

Assistant:

const void* FileDescriptorTables::FindParentForFieldsByMap(
    const FieldDescriptor* field) const {
  if (field->is_extension()) {
    if (field->extension_scope() == nullptr) {
      return field->file();
    } else {
      return field->extension_scope();
    }
  } else {
    return field->containing_type();
  }
}